

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O0

ber_item * BinarySource_get_ber(ber_item *__return_storage_ptr__,BinarySource *src)

{
  byte bVar1;
  ptrlen pVar2;
  ber_item *toret;
  size_t local_30;
  uint local_28;
  int nbytes;
  uchar idbyte;
  size_t length;
  uchar lenbyte;
  uchar leadbyte;
  BinarySource *src_local;
  
  bVar1 = BinarySource_get_byte(src->binarysource_);
  __return_storage_ptr__->flags = bVar1 & 0xe0;
  if ((bVar1 & 0x1f) == 0x1f) {
    __return_storage_ptr__->id = 0;
    do {
      bVar1 = BinarySource_get_byte(src->binarysource_);
      __return_storage_ptr__->id = __return_storage_ptr__->id << 7 | bVar1 & 0x7f;
    } while ((bVar1 & 0x80) != 0);
  }
  else {
    __return_storage_ptr__->id = bVar1 & 0x1f;
  }
  bVar1 = BinarySource_get_byte(src->binarysource_);
  if ((bVar1 & 0x80) == 0) {
    _nbytes = (ulong)bVar1;
  }
  else {
    _nbytes = 0;
    local_28 = bVar1 & 0x7f;
    while (0 < (int)local_28) {
      bVar1 = BinarySource_get_byte(src->binarysource_);
      _nbytes = _nbytes << 8 | (ulong)bVar1;
      local_28 = local_28 - 1;
    }
  }
  pVar2 = BinarySource_get_data(src->binarysource_,_nbytes);
  toret = (ber_item *)pVar2.ptr;
  (__return_storage_ptr__->data).ptr = toret;
  local_30 = pVar2.len;
  (__return_storage_ptr__->data).len = local_30;
  return __return_storage_ptr__;
}

Assistant:

static ber_item BinarySource_get_ber(BinarySource *src)
{
    ber_item toret;
    unsigned char leadbyte, lenbyte;
    size_t length;

    leadbyte = get_byte(src);
    toret.flags = (leadbyte & 0xE0);
    if ((leadbyte & 0x1F) == 0x1F) {
        unsigned char idbyte;

        toret.id = 0;
        do {
            idbyte = get_byte(src);
            toret.id = (toret.id << 7) | (idbyte & 0x7F);
        } while (idbyte & 0x80);
    } else {
        toret.id = leadbyte & 0x1F;
    }

    lenbyte = get_byte(src);
    if (lenbyte & 0x80) {
        int nbytes = lenbyte & 0x7F;
        length = 0;
        while (nbytes-- > 0)
            length = (length << 8) | get_byte(src);
    } else {
        length = lenbyte;
    }

    toret.data = get_data(src, length);
    return toret;
}